

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D::IfcCartesianTransformationOperator3D
          (IfcCartesianTransformationOperator3D *this,void **vtt)

{
  void **vtt_local;
  IfcCartesianTransformationOperator3D *this_local;
  
  IfcCartesianTransformationOperator::IfcCartesianTransformationOperator
            (&this->super_IfcCartesianTransformationOperator,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D,_1UL>::
  ObjectHelper((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3D,_1UL> *)
               &(this->super_IfcCartesianTransformationOperator).field_0x68,vtt + 0x10);
  (this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcCartesianTransformationOperator).
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcCartesianTransformationOperator).
                  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcCartesianTransformationOperator).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcCartesianTransformationOperator).field_0x68 = vtt[0x15];
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
             &(this->super_IfcCartesianTransformationOperator).field_0x78);
  return;
}

Assistant:

IfcCartesianTransformationOperator3D() : Object("IfcCartesianTransformationOperator3D") {}